

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::set_texcoord
          (ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
          VertexHandle _vh,Vec2f *_texcoord)

{
  long lVar1;
  
  lVar1 = (long)(this->mesh_->super_Mesh).
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                .vertex_texcoords2D_.super_BasePropHandleT<OpenMesh::VectorT<float,_2>_>.
                super_BaseHandle.idx_;
  if (-1 < lVar1) {
    *(undefined8 *)
     (*(long *)(*(long *)(*(long *)&(this->mesh_->super_Mesh).
                                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                    .super_PolyConnectivity.field_0x10 + lVar1 * 8) + 0x30) +
     (long)(int)_vh.super_BaseHandle.idx_ * 8) = *(undefined8 *)(_texcoord->values_)._M_elems;
  }
  return;
}

Assistant:

virtual void set_texcoord(VertexHandle _vh, const Vec2f& _texcoord) override
  {
    if (mesh_.has_vertex_texcoords2D())
      mesh_.set_texcoord2D(_vh, vector_cast<TexCoord2D>(_texcoord));
  }